

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O0

int __thiscall MGARD::Recomposer<float>::init(Recomposer<float> *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  const_iterator __first;
  const_iterator __last;
  reference puVar2;
  float *pfVar3;
  size_t buffer_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  size_t local_18;
  EVP_PKEY_CTX *local_10;
  Recomposer<float> *local_8;
  
  uVar1 = this->default_batch_size;
  local_10 = ctx;
  local_8 = this;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      (in_stack_ffffffffffffffb8);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     (in_stack_ffffffffffffffb8);
  local_20 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (__first._M_current,__last._M_current);
  puVar2 = __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&local_20);
  local_18 = (ulong)uVar1 * *puVar2 * 4;
  if (this->data_buffer != (float *)0x0) {
    free(this->data_buffer);
  }
  if (this->correction_buffer != (float *)0x0) {
    free(this->correction_buffer);
  }
  if (this->load_v_buffer != (float *)0x0) {
    free(this->load_v_buffer);
  }
  pfVar3 = (float *)malloc(this->data_buffer_size);
  this->data_buffer = pfVar3;
  pfVar3 = (float *)malloc(local_18);
  this->correction_buffer = pfVar3;
  pfVar3 = (float *)malloc(local_18);
  this->load_v_buffer = pfVar3;
  return (int)this;
}

Assistant:

void init(const vector<size_t>& dims){
		size_t buffer_size = default_batch_size * (*max_element(dims.begin(), dims.end())) * sizeof(T);
		// cerr << "buffer_size = " << buffer_size << endl;
		// cerr << "data_buffer_size = " << data_buffer_size << endl;
		if(data_buffer) free(data_buffer);
		if(correction_buffer) free(correction_buffer);
		if(load_v_buffer) free(load_v_buffer);
		data_buffer = (T *) malloc(data_buffer_size);
		correction_buffer = (T *) malloc(buffer_size);
		load_v_buffer = (T *)malloc(buffer_size);
	}